

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

void unoptimized::outputMaps(DefaultInitVec<AttrmapEntry> *attrmap,DefaultInitVec<size_t> *mappings)

{
  bool *this;
  bool bVar1;
  reference pAVar2;
  reference pvVar3;
  File *pFVar4;
  streambuf *psVar5;
  undefined1 auStack_358 [7];
  uint8_t palID;
  AttrmapEntry attr;
  const_iterator __end1;
  const_iterator __begin1;
  DefaultInitVec<AttrmapEntry> *__range1;
  uint8_t bank;
  uint8_t tileID;
  anon_class_1_0_00000001 local_319;
  undefined1 local_318 [7];
  anon_class_1_0_00000001 autoOpenPath;
  optional<File> palmapOutput;
  optional<File> attrmapOutput;
  optional<File> tilemapOutput;
  DefaultInitVec<size_t> *mappings_local;
  DefaultInitVec<AttrmapEntry> *attrmap_local;
  
  this = &attrmapOutput.super__Optional_base<File,_false,_false>._M_payload.
          super__Optional_payload<File,_true,_false,_false>.super__Optional_payload_base<File>.
          _M_engaged;
  std::optional<File>::optional((optional<File> *)this);
  std::optional<File>::optional
            ((optional<File> *)
             &palmapOutput.super__Optional_base<File,_false,_false>._M_payload.
              super__Optional_payload<File,_true,_false,_false>.super__Optional_payload_base<File>.
              _M_engaged);
  std::optional<File>::optional((optional<File> *)local_318);
  local_319 = (anon_class_1_0_00000001)0x0;
  outputMaps::anon_class_1_0_00000001::operator()
            (&local_319,&options.tilemap,(optional<File> *)this);
  outputMaps::anon_class_1_0_00000001::operator()
            (&local_319,&options.attrmap,
             (optional<File> *)
             &palmapOutput.super__Optional_base<File,_false,_false>._M_payload.
              super__Optional_payload<File,_true,_false,_false>.super__Optional_payload_base<File>.
              _M_engaged);
  outputMaps::anon_class_1_0_00000001::operator()
            (&local_319,&options.palmap,(optional<File> *)local_318);
  __range1._3_1_ = 0;
  __range1._2_1_ = 0;
  __end1 = std::
           vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
           ::begin(attrmap);
  attr._8_8_ = std::
               vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>
               ::end(attrmap);
  do {
    bVar1 = __gnu_cxx::
            operator==<const_AttrmapEntry_*,_std::vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>_>
                      (&__end1,(__normal_iterator<const_AttrmapEntry_*,_std::vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>_>
                                *)&attr.tileID);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::optional<File>::~optional((optional<File> *)local_318);
      std::optional<File>::~optional
                ((optional<File> *)
                 &palmapOutput.super__Optional_base<File,_false,_false>._M_payload.
                  super__Optional_payload<File,_true,_false,_false>.
                  super__Optional_payload_base<File>._M_engaged);
      std::optional<File>::~optional
                ((optional<File> *)
                 &attrmapOutput.super__Optional_base<File,_false,_false>._M_payload.
                  super__Optional_payload<File,_true,_false,_false>.
                  super__Optional_payload_base<File>._M_engaged);
      return;
    }
    pAVar2 = __gnu_cxx::
             __normal_iterator<const_AttrmapEntry_*,_std::vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>_>
             ::operator*(&__end1);
    _auStack_358 = pAVar2->protoPaletteID;
    attr.protoPaletteID._0_1_ = pAVar2->tileID;
    attr.protoPaletteID._1_1_ = pAVar2->bank;
    attr.protoPaletteID._2_1_ = pAVar2->yFlip;
    attr.protoPaletteID._3_1_ = pAVar2->xFlip;
    attr.protoPaletteID._4_4_ = *(undefined4 *)&pAVar2->field_0xc;
    pvVar3 = std::array<unsigned_short,_2UL>::operator[](&options.maxNbTiles,(ulong)__range1._2_1_);
    if ((ushort)__range1._3_1_ == *pvVar3) {
      if (__range1._2_1_ != 0) {
        __assert_fail("bank == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                      ,0x33d,"outputMaps");
      }
      __range1._2_1_ = 1;
      __range1._3_1_ = 0;
    }
    bVar1 = std::optional<File>::has_value
                      ((optional<File> *)
                       &attrmapOutput.super__Optional_base<File,_false,_false>._M_payload.
                        super__Optional_payload<File,_true,_false,_false>.
                        super__Optional_payload_base<File>._M_engaged);
    if (bVar1) {
      pFVar4 = std::optional<File>::operator*
                         ((optional<File> *)
                          &attrmapOutput.super__Optional_base<File,_false,_false>._M_payload.
                           super__Optional_payload<File,_true,_false,_false>.
                           super__Optional_payload_base<File>._M_engaged);
      psVar5 = File::operator->(pFVar4);
      std::array<unsigned_char,_2UL>::operator[](&options.baseTileIDs,(ulong)__range1._2_1_);
      std::streambuf::sputc((char)psVar5);
    }
    bVar1 = std::optional<File>::has_value
                      ((optional<File> *)
                       &palmapOutput.super__Optional_base<File,_false,_false>._M_payload.
                        super__Optional_payload<File,_true,_false,_false>.
                        super__Optional_payload_base<File>._M_engaged);
    if (bVar1) {
      AttrmapEntry::getPalID((AttrmapEntry *)auStack_358,mappings);
      pFVar4 = std::optional<File>::operator*
                         ((optional<File> *)
                          &palmapOutput.super__Optional_base<File,_false,_false>._M_payload.
                           super__Optional_payload<File,_true,_false,_false>.
                           super__Optional_payload_base<File>._M_engaged);
      psVar5 = File::operator->(pFVar4);
      std::streambuf::sputc((char)psVar5);
    }
    bVar1 = std::optional<File>::has_value((optional<File> *)local_318);
    if (bVar1) {
      pFVar4 = std::optional<File>::operator*((optional<File> *)local_318);
      psVar5 = File::operator->(pFVar4);
      AttrmapEntry::getPalID((AttrmapEntry *)auStack_358,mappings);
      std::streambuf::sputc((char)psVar5);
    }
    __range1._3_1_ = __range1._3_1_ + 1;
    __gnu_cxx::
    __normal_iterator<const_AttrmapEntry_*,_std::vector<AttrmapEntry,_default_init_allocator<AttrmapEntry,_std::allocator<AttrmapEntry>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

static void outputMaps(DefaultInitVec<AttrmapEntry> const &attrmap,
                       DefaultInitVec<size_t> const &mappings) {
	std::optional<File> tilemapOutput, attrmapOutput, palmapOutput;
	auto autoOpenPath = [](std::optional<std::filesystem::path> &path, std::optional<File> &file) {
		if (path.has_value()) {
			file.emplace();
			if (!file->open(*path, std::ios_base::out | std::ios_base::binary)) {
				fatal("Failed to open \"%s\": %s", file->string(*path).c_str(),
				      strerror(errno));
			}
		}
	};
	autoOpenPath(options.tilemap, tilemapOutput);
	autoOpenPath(options.attrmap, attrmapOutput);
	autoOpenPath(options.palmap, palmapOutput);

	uint8_t tileID = 0;
	uint8_t bank = 0;
	for (auto attr : attrmap) {
		if (tileID == options.maxNbTiles[bank]) {
			assert(bank == 0);
			bank = 1;
			tileID = 0;
		}

		if (tilemapOutput.has_value()) {
			(*tilemapOutput)->sputc(tileID + options.baseTileIDs[bank]);
		}
		if (attrmapOutput.has_value()) {
			uint8_t palID = attr.getPalID(mappings) & 7;
			(*attrmapOutput)->sputc(palID | bank << 3); // The other flags are all 0
		}
		if (palmapOutput.has_value()) {
			(*palmapOutput)->sputc(attr.getPalID(mappings));
		}
		++tileID;
	}
}